

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnLocalNameLocalCount
          (BinaryReaderIR *this,Index index,Index count)

{
  Index IVar1;
  size_type sVar2;
  reference ppFVar3;
  Index num_params_and_locals;
  Func *func;
  Index count_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  sVar2 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&this->module_->funcs);
  if (index < sVar2) {
    ppFVar3 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::operator[]
                        (&this->module_->funcs,(ulong)index);
    IVar1 = Func::GetNumParamsAndLocals(*ppFVar3);
    if (IVar1 < count) {
      PrintError(this,"expected local name count (%u) <= local count (%u)",(ulong)count,(ulong)IVar1
                );
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    return (Result)this_local._4_4_;
  }
  __assert_fail("index < module_->funcs.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-reader-ir.cc"
                ,0x619,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnLocalNameLocalCount(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnLocalNameLocalCount(Index index, Index count) {
  assert(index < module_->funcs.size());
  Func* func = module_->funcs[index];
  Index num_params_and_locals = func->GetNumParamsAndLocals();
  if (count > num_params_and_locals) {
    PrintError("expected local name count (%" PRIindex
               ") <= local count (%" PRIindex ")",
               count, num_params_and_locals);
    return Result::Error;
  }
  return Result::Ok;
}